

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::AppendImport
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aXpanId,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  Error *pEVar5;
  size_type sVar6;
  reference other;
  char *pcVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_218 [8];
  _Alloc_hider local_210;
  undefined1 local_208 [24];
  parse_func local_1f0 [1];
  Json jsonSrc;
  string jsonStr;
  Json json;
  ActiveOperationalDataset dataset;
  undefined1 local_c0 [40];
  string local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_58;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  jsonStr._M_dataplus._M_p = (pointer)&jsonStr.field_2;
  jsonStr._M_string_length = 0;
  jsonStr.field_2._M_local_buf[0] = '\0';
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&jsonSrc,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&json,(nullptr_t)0x0);
  JsonFromFile((Error *)&dataset,&jsonStr,&this->mImportFile);
  pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)&dataset);
  EVar1 = pEVar5->mCode;
  std::__cxx11::string::~string((string *)&dataset.mExtendedPanId);
  if (EVar1 != kNone) goto LAB_00141a9c;
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)&dataset,&jsonStr);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&local_58,(input_adapter *)&dataset,(parser_callback_t *)&local_48,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(&jsonSrc,&local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dataset.mExtendedPanId);
  if (aXpanId == 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&local_68,&jsonSrc);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(&json,&local_68);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_68);
  }
  else {
    utils::Hex<unsigned_long>((string *)&dataset,aXpanId);
    sVar6 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::count<std::__cxx11::string>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)&jsonSrc,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dataset
                      );
    std::__cxx11::string::~string((string *)&dataset);
    if (sVar6 != 0) {
      utils::Hex<unsigned_long>((string *)&dataset,aXpanId);
      other = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](&jsonSrc,(key_type *)&dataset);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&local_78,other);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(&json,&local_78);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_78);
      std::__cxx11::string::~string((string *)&dataset);
    }
  }
  aVar9.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump((string_t *)&dataset,&json,4,' ',false,strict);
  std::__cxx11::string::operator=((string *)&jsonStr,(string *)&dataset);
  std::__cxx11::string::~string((string *)&dataset);
  utils::ToLower((string *)&dataset,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &dataset,"opdataset");
  std::__cxx11::string::~string((string *)&dataset);
  if (!bVar4) {
    utils::ToLower((string *)&dataset,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &dataset,"bbrdataset");
    std::__cxx11::string::~string((string *)&dataset);
    if (!bVar4) {
      utils::ToLower((string *)&dataset,
                     (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &dataset,"commdataset");
      std::__cxx11::string::~string((string *)&dataset);
      if (!bVar4) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                      ,0x26c,
                      "Error ot::commissioner::JobManager::AppendImport(uint64_t, Interpreter::Expression &)"
                     );
      }
      dataset.mActiveTimestamp = (Timestamp)((ulong)(uint)dataset.mActiveTimestamp._4_4_ << 0x20);
      dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      dataset.mPanId = 0;
      dataset._34_6_ = 0;
      dataset.mNetworkName._M_dataplus._M_p = (pointer)0x0;
      dataset.mNetworkName._M_string_length = 0;
      dataset.mNetworkName.field_2._M_allocated_capacity = 0;
      dataset.mNetworkName.field_2._8_8_ = 0;
      dataset.mChannel.mPage = '\0';
      dataset.mChannel._1_1_ = 0;
      dataset.mChannel.mNumber = 0;
      dataset._76_4_ = 0;
      dataset.mChannelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x40) {
        utils::ToLower((string *)local_218,pbVar2 + 1);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_218,"set");
        std::__cxx11::string::~string((string *)local_218);
        if (!bVar4) goto LAB_001421c4;
        CommissionerDatasetFromJson((Error *)local_218,(CommissionerDataset *)&dataset,&jsonStr);
        Error::operator=(__return_storage_ptr__,(Error *)local_218);
        std::__cxx11::string::~string((string *)&local_210);
        local_218._0_4_ = none_type;
        local_210._M_p = local_208 + 8;
        local_208._0_8_ = 0;
        local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
        EVar1 = __return_storage_ptr__->mCode;
        std::__cxx11::string::~string((string *)&local_210);
        if (EVar1 == kNone) {
LAB_00142142:
          CommissionerDataset::~CommissionerDataset((CommissionerDataset *)&dataset);
          goto LAB_00142421;
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump((string_t *)local_218,&jsonSrc,4,' ',false,strict);
        std::__cxx11::string::operator=((string *)&jsonStr,(string *)local_218);
        std::__cxx11::string::~string((string *)local_218);
        CommissionerDatasetFromJson((Error *)local_218,(CommissionerDataset *)&dataset,&jsonStr);
        pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_218);
        EVar1 = pEVar5->mCode;
        std::__cxx11::string::~string((string *)&local_210);
        if (EVar1 == kNone) goto LAB_00142142;
      }
      else {
LAB_001421c4:
        local_218._0_4_ = none_type;
        local_210._M_p = "import usupported";
        local_208._0_8_ = 0x11;
        local_208._8_8_ = 0;
        local_1f0[0] = (parse_func)0x0;
        pcVar8 = "import usupported";
        local_208._16_8_ = local_218;
        while (pcVar7 = pcVar8, pcVar7 != "") {
          pcVar8 = pcVar7 + 1;
          if (*pcVar7 == '}') {
            if ((pcVar8 == "") || (*pcVar8 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar8 = pcVar7 + 2;
          }
          else if (*pcVar7 == '{') {
            pcVar8 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar7,"",(format_string_checker<char> *)local_218);
          }
        }
        args_01.field_1.args_ = aVar9.args_;
        args_01.desc_ = (unsigned_long_long)local_218;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_98,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args_01);
        local_c0._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_c0 + 8),(string *)&local_98);
        Error::operator=(__return_storage_ptr__,(Error *)local_c0);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        std::__cxx11::string::~string((string *)&local_98);
      }
      CommissionerDataset::~CommissionerDataset((CommissionerDataset *)&dataset);
      goto LAB_00141a9c;
    }
    dataset.mActiveTimestamp =
         (Timestamp)
         &dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)((ulong)dataset.mExtendedPanId.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    dataset._32_8_ = &dataset.mNetworkName._M_string_length;
    dataset.mNetworkName._M_dataplus._M_p = (pointer)0x0;
    dataset.mNetworkName._M_string_length =
         dataset.mNetworkName._M_string_length & 0xffffffffffffff00;
    dataset.mNetworkName.field_2._8_8_ = &dataset.mChannelMask;
    dataset.mChannel.mPage = '\0';
    dataset.mChannel._1_1_ = 0;
    dataset.mChannel.mNumber = 0;
    dataset._76_4_ = 0;
    dataset.mChannelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)dataset.mChannelMask.
                          super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    dataset.mChannelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x40) {
      utils::ToLower((string *)local_218,pbVar2 + 1);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_218,"set");
      std::__cxx11::string::~string((string *)local_218);
      if (!bVar4) goto LAB_00142151;
      BbrDatasetFromJson((Error *)local_218,(BbrDataset *)&dataset,&jsonStr);
      Error::operator=(__return_storage_ptr__,(Error *)local_218);
      std::__cxx11::string::~string((string *)&local_210);
      local_218._0_4_ = none_type;
      local_210._M_p = local_208 + 8;
      local_208._0_8_ = 0;
      local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
      EVar1 = __return_storage_ptr__->mCode;
      std::__cxx11::string::~string((string *)&local_210);
      if (EVar1 == kNone) {
LAB_00141ef2:
        BbrDataset::~BbrDataset((BbrDataset *)&dataset);
        goto LAB_00142421;
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump((string_t *)local_218,&jsonSrc,4,' ',false,strict);
      std::__cxx11::string::operator=((string *)&jsonStr,(string *)local_218);
      std::__cxx11::string::~string((string *)local_218);
      BbrDatasetFromJson((Error *)local_218,(BbrDataset *)&dataset,&jsonStr);
      pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_218);
      EVar1 = pEVar5->mCode;
      std::__cxx11::string::~string((string *)&local_210);
      if (EVar1 == kNone) goto LAB_00141ef2;
    }
    else {
LAB_00142151:
      local_218._0_4_ = none_type;
      local_210._M_p = "import usupported";
      local_208._0_8_ = 0x11;
      local_208._8_8_ = 0;
      local_1f0[0] = (parse_func)0x0;
      pcVar8 = "import usupported";
      local_208._16_8_ = local_218;
      while (pcVar7 = pcVar8, pcVar7 != "") {
        pcVar8 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar8 == "") || (*pcVar8 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar8 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",(format_string_checker<char> *)local_218);
        }
      }
      args_00.field_1.args_ = aVar9.args_;
      args_00.desc_ = (unsigned_long_long)local_218;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_98,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args_00);
      local_c0._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_c0 + 8),(string *)&local_98);
      Error::operator=(__return_storage_ptr__,(Error *)local_c0);
      std::__cxx11::string::~string((string *)(local_c0 + 8));
      std::__cxx11::string::~string((string *)&local_98);
    }
    BbrDataset::~BbrDataset((BbrDataset *)&dataset);
    goto LAB_00141a9c;
  }
  utils::ToLower((string *)&dataset,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &dataset,"set");
  if (bVar4) {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&dataset);
    if ((long)pbVar2 - (long)pbVar3 != 0x60) goto LAB_00141f0b;
    utils::ToLower((string *)&dataset,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 2);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &dataset,"active");
    std::__cxx11::string::~string((string *)&dataset);
    if (bVar4) {
      ActiveOperationalDataset::ActiveOperationalDataset(&dataset);
      ActiveDatasetFromJson((Error *)local_218,&dataset,&jsonStr);
      Error::operator=(__return_storage_ptr__,(Error *)local_218);
      std::__cxx11::string::~string((string *)&local_210);
      local_218._0_4_ = none_type;
      local_210._M_p = local_208 + 8;
      local_208._0_8_ = 0;
      local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
      EVar1 = __return_storage_ptr__->mCode;
      std::__cxx11::string::~string((string *)&local_210);
      if (EVar1 != kNone) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump((string_t *)local_218,&jsonSrc,4,' ',false,strict);
        std::__cxx11::string::operator=((string *)&jsonStr,(string *)local_218);
        std::__cxx11::string::~string((string *)local_218);
        ActiveDatasetFromJson((Error *)local_218,&dataset,&jsonStr);
LAB_001423ed:
        pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_218);
        EVar1 = pEVar5->mCode;
        std::__cxx11::string::~string((string *)&local_210);
        if (EVar1 != kNone) {
          ActiveOperationalDataset::~ActiveOperationalDataset(&dataset);
          goto LAB_00141a9c;
        }
      }
LAB_00142417:
      ActiveOperationalDataset::~ActiveOperationalDataset(&dataset);
LAB_00142421:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(aExpr,&jsonStr);
      goto LAB_00141a9c;
    }
    utils::ToLower((string *)&dataset,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 2);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &dataset,"pending");
    std::__cxx11::string::~string((string *)&dataset);
    if (bVar4) {
      PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)&dataset);
      PendingDatasetFromJson((Error *)local_218,(PendingOperationalDataset *)&dataset,&jsonStr);
      Error::operator=(__return_storage_ptr__,(Error *)local_218);
      std::__cxx11::string::~string((string *)&local_210);
      local_218._0_4_ = none_type;
      local_210._M_p = local_208 + 8;
      local_208._0_8_ = 0;
      local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
      EVar1 = __return_storage_ptr__->mCode;
      std::__cxx11::string::~string((string *)&local_210);
      if (EVar1 != kNone) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump((string_t *)local_218,&jsonSrc,4,' ',false,strict);
        std::__cxx11::string::operator=((string *)&jsonStr,(string *)local_218);
        std::__cxx11::string::~string((string *)local_218);
        PendingDatasetFromJson((Error *)local_218,(PendingOperationalDataset *)&dataset,&jsonStr);
        goto LAB_001423ed;
      }
      goto LAB_00142417;
    }
    dataset.mActiveTimestamp = (Timestamp)((ulong)dataset.mActiveTimestamp & 0xffffffff00000000);
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = "import usupported";
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x11;
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mNetworkName._M_dataplus._M_p = (pointer)0x0;
    pcVar8 = "import usupported";
    dataset._32_8_ = &dataset;
    while (pcVar7 = pcVar8, pcVar7 != "") {
      pcVar8 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)&dataset);
      }
    }
    args_02.field_1.args_ = aVar9.args_;
    args_02.desc_ = (unsigned_long_long)&dataset;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_c0,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args_02);
    local_218._0_4_ = uint_type;
    std::__cxx11::string::string((string *)&local_210,(string *)local_c0);
  }
  else {
    std::__cxx11::string::~string((string *)&dataset);
LAB_00141f0b:
    dataset.mActiveTimestamp = (Timestamp)((ulong)dataset.mActiveTimestamp & 0xffffffff00000000);
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = "import usupported";
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x11;
    dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mNetworkName._M_dataplus._M_p = (pointer)0x0;
    pcVar8 = "import usupported";
    dataset._32_8_ = &dataset;
    while (pcVar7 = pcVar8, pcVar7 != "") {
      pcVar8 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)&dataset);
      }
    }
    args.field_1.args_ = aVar9.args_;
    args.desc_ = (unsigned_long_long)&dataset;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_c0,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args);
    local_218._0_4_ = uint_type;
    std::__cxx11::string::string((string *)&local_210,(string *)local_c0);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_218);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_c0);
LAB_00141a9c:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&jsonSrc);
  std::__cxx11::string::~string((string *)&jsonStr);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::AppendImport(uint64_t aXpanId, Interpreter::Expression &aExpr)
{
    Error       error;
    std::string jsonStr;
    Json        jsonSrc;
    Json        json;

    SuccessOrExit(error = JsonFromFile(jsonStr, mImportFile));
    jsonSrc = Json::parse(jsonStr);
    if (aXpanId == 0) // must be single command
    {
        json = jsonSrc;
    }
    else if (jsonSrc.count(utils::Hex(aXpanId)) > 0)
    {
        json = jsonSrc[utils::Hex(aXpanId)];
    }
    jsonStr = json.dump(JSON_INDENT_DEFAULT);
    if (utils::ToLower(aExpr[0]) == "opdataset")
    {
        VerifyOrExit(utils::ToLower(aExpr[1]) == "set" && aExpr.size() == 3,
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        if (utils::ToLower(aExpr[2]) == "active")
        {
            ActiveOperationalDataset dataset;
            error = ActiveDatasetFromJson(dataset, jsonStr);
            if (error != ERROR_NONE)
            {
                jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
                SuccessOrExit(error = ActiveDatasetFromJson(dataset, jsonStr));
            }
            // TODO: try importing wrong format
        }
        else if (utils::ToLower(aExpr[2]) == "pending")
        {
            PendingOperationalDataset dataset;
            error = PendingDatasetFromJson(dataset, jsonStr);
            if (error != ERROR_NONE)
            {
                jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
                SuccessOrExit(error = PendingDatasetFromJson(dataset, jsonStr));
            }
            // TODO: try importing wrong format
        }
        else
        {
            ExitNow(error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        }
    }
    else if (utils::ToLower(aExpr[0]) == "bbrdataset")
    {
        BbrDataset dataset;
        VerifyOrExit(aExpr.size() == 2 && utils::ToLower(aExpr[1]) == "set",
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        error = BbrDatasetFromJson(dataset, jsonStr);
        if (error != ERROR_NONE)
        {
            jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
            SuccessOrExit(error = BbrDatasetFromJson(dataset, jsonStr));
        }
        // TODO: try importing wrong format
    }
    else if (utils::ToLower(aExpr[0]) == "commdataset")
    {
        CommissionerDataset dataset;
        VerifyOrExit(aExpr.size() == 2 && utils::ToLower(aExpr[1]) == "set",
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        error = CommissionerDatasetFromJson(dataset, jsonStr);
        if (error != ERROR_NONE)
        {
            jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
            SuccessOrExit(error = CommissionerDatasetFromJson(dataset, jsonStr));
        }
        // TODO: try importing wrong format
    }
    else
    {
        ASSERT(false); // never to reach here
    }
    aExpr.push_back(jsonStr);
exit:
    return error;
}